

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O3

void __thiscall sf::priv::WindowImplX11::setVideoMode(WindowImplX11 *this,VideoMode *mode)

{
  short sVar1;
  undefined8 uVar2;
  RRCrtc RVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  long lVar8;
  uint *puVar9;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  int xRandRMinor;
  int xRandRMajor;
  RROutput output;
  uint local_38;
  
  _output = VideoMode::getDesktopMode();
  bVar4 = operator==(mode,(VideoMode *)&output);
  if (bVar4) {
    return;
  }
  bVar4 = checkXRandR(this,&xRandRMajor,&xRandRMinor);
  if (bVar4) {
    uVar2 = *(undefined8 *)(*(long *)(this->m_display + 0xe8) + 0x10 + (long)this->m_screen * 0x80);
    lVar5 = XRRGetScreenResources(this->m_display,uVar2);
    if (lVar5 == 0) {
      poVar7 = err();
      pcVar12 = 
      "Failed to get the current screen resources for fullscreen mode, switching to window mode";
      lVar5 = 0x58;
    }
    else {
      if (((xRandRMajor < 2) && (xRandRMajor != 1 || xRandRMinor < 3)) ||
         (lVar6 = XRRGetOutputPrimary(this->m_display,uVar2), lVar6 == 0)) {
        lVar6 = **(long **)(lVar5 + 0x28);
      }
      output = lVar6;
      lVar6 = XRRGetOutputInfo(this->m_display,lVar5);
      if (lVar6 == 0) {
        XRRFreeScreenResources(lVar5);
      }
      else {
        if (*(short *)(lVar6 + 0x30) != 1) {
          lVar8 = XRRGetCrtcInfo(this->m_display,lVar5,*(undefined8 *)(lVar6 + 8));
          if (lVar8 == 0) {
            XRRFreeScreenResources(lVar5);
            XRRFreeOutputInfo(lVar6);
            poVar7 = err();
            pcVar12 = "Failed to get crtc info for fullscreen mode, switching to window mode";
            lVar5 = 0x45;
          }
          else {
            if (0 < *(int *)(lVar5 + 0x30)) {
              sVar1 = *(short *)(lVar8 + 0x20);
              puVar9 = (uint *)(*(long *)(lVar5 + 0x38) + 0xc);
              lVar10 = 0;
              do {
                if ((sVar1 == 2) || (sVar1 == 8)) {
                  uVar11 = *puVar9;
                  *puVar9 = puVar9[-1];
                  puVar9[-1] = uVar11;
                }
                else {
                  uVar11 = puVar9[-1];
                }
                if ((uVar11 == mode->width) && (*puVar9 == mode->height)) {
                  uVar2 = *(undefined8 *)(puVar9 + -3);
                  this->m_oldVideoMode = *(int *)(lVar8 + 0x18);
                  RVar3 = *(RRCrtc *)(lVar6 + 8);
                  this->m_oldRRCrtc = RVar3;
                  XRRSetCrtcConfig(this->m_display,lVar5,RVar3,0,*(undefined4 *)(lVar8 + 8),
                                   *(undefined4 *)(lVar8 + 0xc),uVar2,*(undefined2 *)(lVar8 + 0x20),
                                   (VideoMode *)&output,1);
                  (anonymous_namespace)::fullscreenWindow = this;
                  XRRFreeScreenResources(lVar5);
                  XRRFreeOutputInfo(lVar6);
                  XRRFreeCrtcInfo(lVar8);
                  return;
                }
                lVar10 = lVar10 + 1;
                puVar9 = puVar9 + 0x14;
              } while (lVar10 < *(int *)(lVar5 + 0x30));
            }
            XRRFreeScreenResources(lVar5);
            XRRFreeOutputInfo(lVar6);
            poVar7 = err();
            pcVar12 = 
            "Failed to find a matching RRMode for fullscreen mode, switching to window mode";
            lVar5 = 0x4e;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar12,lVar5);
          std::endl<char,std::char_traits<char>>(poVar7);
          return;
        }
        XRRFreeScreenResources(lVar5);
        XRRFreeOutputInfo(lVar6);
      }
      poVar7 = err();
      pcVar12 = "Failed to get output info for fullscreen mode, switching to window mode";
      lVar5 = 0x47;
    }
  }
  else {
    poVar7 = err();
    pcVar12 = "Fullscreen is not supported, switching to window mode";
    lVar5 = 0x35;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar12,lVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  return;
}

Assistant:

void WindowImplX11::setVideoMode(const VideoMode& mode)
{
    // Skip mode switching if the new mode is equal to the desktop mode
    if (mode == VideoMode::getDesktopMode())
        return;

    // Check if the XRandR extension is present
    int xRandRMajor, xRandRMinor;
    if (!checkXRandR(xRandRMajor, xRandRMinor))
    {
        // XRandR extension is not supported: we cannot use fullscreen mode
        err() << "Fullscreen is not supported, switching to window mode" << std::endl;
        return;
    }

    // Get root window
    ::Window rootWindow = RootWindow(m_display, m_screen);

    // Get the screen resources
    XRRScreenResources* res = XRRGetScreenResources(m_display, rootWindow);
    if (!res)
    {
        err() << "Failed to get the current screen resources for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    RROutput output = getOutputPrimary(rootWindow, res, xRandRMajor, xRandRMinor);

    // Get output info from output
    XRROutputInfo* outputInfo = XRRGetOutputInfo(m_display, res, output);
    if (!outputInfo || outputInfo->connection == RR_Disconnected)
    {
        XRRFreeScreenResources(res);

        // If outputInfo->connection == RR_Disconnected, free output info
        if (outputInfo)
            XRRFreeOutputInfo(outputInfo);

        err() << "Failed to get output info for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    // Retreive current RRMode, screen position and rotation
    XRRCrtcInfo* crtcInfo = XRRGetCrtcInfo(m_display, res, outputInfo->crtc);
    if (!crtcInfo)
    {
        XRRFreeScreenResources(res);
        XRRFreeOutputInfo(outputInfo);
        err() << "Failed to get crtc info for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    // Find RRMode to set
    bool modeFound = false;
    RRMode xRandMode;

    for (int i = 0; (i < res->nmode) && !modeFound; i++)
    {
        if (crtcInfo->rotation == RR_Rotate_90 || crtcInfo->rotation == RR_Rotate_270)
            std::swap(res->modes[i].height, res->modes[i].width);

        // Check if screen size match
        if (res->modes[i].width == static_cast<int>(mode.width) &&
            res->modes[i].height == static_cast<int>(mode.height))
        {
            xRandMode = res->modes[i].id;
            modeFound = true;
        }
    }

    if (!modeFound)
    {
        XRRFreeScreenResources(res);
        XRRFreeOutputInfo(outputInfo);
        err() << "Failed to find a matching RRMode for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    // Save the current video mode before we switch to fullscreen
    m_oldVideoMode = crtcInfo->mode;
    m_oldRRCrtc = outputInfo->crtc;

    // Switch to fullscreen mode
    XRRSetCrtcConfig(m_display,
                     res,
                     outputInfo->crtc,
                     CurrentTime,
                     crtcInfo->x,
                     crtcInfo->y,
                     xRandMode,
                     crtcInfo->rotation,
                     &output,
                     1);

    // Set "this" as the current fullscreen window
    fullscreenWindow = this;

    XRRFreeScreenResources(res);
    XRRFreeOutputInfo(outputInfo);
    XRRFreeCrtcInfo(crtcInfo);
}